

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  FilePath *directory_00;
  string *psVar1;
  char *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  FilePath local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0 [32];
  string local_c0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [32];
  undefined1 local_50 [8];
  string file;
  char *extension_local;
  FilePath *pFStack_20;
  int number_local;
  FilePath *base_name_local;
  FilePath *directory_local;
  
  file.field_2._8_8_ = extension;
  extension_local._4_4_ = number;
  pFStack_20 = base_name;
  base_name_local = directory;
  directory_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)local_50);
  if (extension_local._4_4_ == 0) {
    psVar1 = string_abi_cxx11_(pFStack_20);
    std::operator+(&local_90,psVar1,".");
    std::operator+(psVar1,in_stack_fffffffffffffe80);
    std::__cxx11::string::operator=((string *)local_50,local_70);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    psVar1 = string_abi_cxx11_(pFStack_20);
    std::operator+(&local_120,psVar1,"_");
    StreamableToString<int>(&local_140,(int *)((long)&extension_local + 4));
    std::operator+(&local_100,&local_120,&local_140);
    std::operator+(in_stack_fffffffffffffe88,(char *)psVar1);
    std::operator+(in_stack_fffffffffffffe88,(char *)psVar1);
    std::__cxx11::string::operator=((string *)local_50,local_c0);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
  }
  directory_00 = base_name_local;
  FilePath(&local_160,(string *)local_50);
  ConcatPaths(__return_storage_ptr__,directory_00,&local_160);
  ~FilePath(&local_160);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file = base_name.string() + "_" + StreamableToString(number)
        + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}